

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_picotls(void)

{
  ptls_lookup_certificate_t local_10;
  ptls_lookup_certificate_t lc;
  
  subtest("hmac-sha256",test_hmac_sha256);
  subtest("hkdf",test_hkdf);
  subtest("aead-aes128gcm",test_aes128gcm);
  local_10.cb = lookup_certificate;
  lc_orig = ctx_peer->lookup_certificate;
  ctx_peer->lookup_certificate = &local_10;
  subtest("full-handshake",test_full_handshake);
  subtest("resumption",test_resumption);
  ctx_peer->lookup_certificate = lc_orig;
  return;
}

Assistant:

void test_picotls(void)
{
    subtest("hmac-sha256", test_hmac_sha256);
    subtest("hkdf", test_hkdf);
    subtest("aead-aes128gcm", test_aes128gcm);

    ptls_lookup_certificate_t lc = {lookup_certificate};
    lc_orig = ctx_peer->lookup_certificate;
    ctx_peer->lookup_certificate = &lc;

    subtest("full-handshake", test_full_handshake);
    subtest("resumption", test_resumption);

    ctx_peer->lookup_certificate = lc_orig;
}